

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_restore_state(ALLEGRO_STATE *state)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ALLEGRO_FS_INTERFACE *pAVar6;
  thread_local_state *ptVar7;
  size_t n;
  ALLEGRO_BITMAP *pAVar8;
  
  ptVar7 = tls_get();
  if (ptVar7 != (thread_local_state *)0x0) {
    uVar1 = *(uint *)(state->_tls + 0x2d0);
    if ((uVar1 & 1) != 0) {
      uVar2 = *(undefined8 *)state->_tls;
      uVar3 = *(undefined8 *)(state->_tls + 8);
      ptVar7->new_display_flags = (int)uVar2;
      ptVar7->new_display_refresh_rate = (int)((ulong)uVar2 >> 0x20);
      ptVar7->new_display_adapter = (int)uVar3;
      ptVar7->new_window_x = (int)((ulong)uVar3 >> 0x20);
      ptVar7->new_window_y = *(int *)(state->_tls + 0x10);
      memcpy(&ptVar7->new_display_settings,state->_tls + 0x20,0xb0);
      n = strlen(ptVar7->new_window_title);
      _al_sane_strncpy(ptVar7->new_window_title,state->_tls + 0x124,n);
    }
    if ((uVar1 & 2) != 0) {
      uVar2 = *(undefined8 *)(state->_tls + 0x108);
      ptVar7->new_bitmap_format = (int)uVar2;
      ptVar7->new_bitmap_flags = (int)((ulong)uVar2 >> 0x20);
    }
    if (((uVar1 & 4) != 0) && (ptVar7->current_display != *(ALLEGRO_DISPLAY **)(state->_tls + 0xd0))
       ) {
      _al_set_current_display_only(*(ALLEGRO_DISPLAY **)(state->_tls + 0xd0));
    }
    if (((uVar1 & 8) != 0) && (ptVar7->target_bitmap != *(ALLEGRO_BITMAP **)(state->_tls + 0xd8))) {
      al_set_target_bitmap(*(ALLEGRO_BITMAP **)(state->_tls + 0xd8));
    }
    if ((uVar1 & 0x10) != 0) {
      uVar2 = *(undefined8 *)(state->_tls + 0x248);
      (ptVar7->current_blender).blend_color.b = (float)(int)uVar2;
      (ptVar7->current_blender).blend_color.a = (float)(int)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)(state->_tls + 0x228);
      uVar3 = *(undefined8 *)(state->_tls + 0x230);
      uVar4 = *(undefined8 *)(state->_tls + 0x238);
      uVar5 = *(undefined8 *)(state->_tls + 0x240);
      (ptVar7->current_blender).blend_alpha_source = (int)uVar4;
      (ptVar7->current_blender).blend_alpha_dest = (int)((ulong)uVar4 >> 0x20);
      (ptVar7->current_blender).blend_color.r = (float)(int)uVar5;
      (ptVar7->current_blender).blend_color.g = (float)(int)((ulong)uVar5 >> 0x20);
      (ptVar7->current_blender).blend_op = (int)uVar2;
      (ptVar7->current_blender).blend_source = (int)((ulong)uVar2 >> 0x20);
      (ptVar7->current_blender).blend_dest = (int)uVar3;
      (ptVar7->current_blender).blend_alpha_op = (int)((ulong)uVar3 >> 0x20);
    }
    if ((uVar1 & 0x20) != 0) {
      pAVar6 = *(ALLEGRO_FS_INTERFACE **)(state->_tls + 0x118);
      ptVar7->new_file_interface = *(ALLEGRO_FILE_INTERFACE **)(state->_tls + 0x110);
      ptVar7->fs_interface = pAVar6;
    }
    if ((uVar1 & 0x40) != 0) {
      pAVar8 = al_get_target_bitmap();
      if (pAVar8 != (ALLEGRO_BITMAP *)0x0) {
        al_use_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x250));
      }
    }
    if ((uVar1 >> 8 & 1) != 0) {
      pAVar8 = al_get_target_bitmap();
      if (pAVar8 != (ALLEGRO_BITMAP *)0x0) {
        al_use_projection_transform((ALLEGRO_TRANSFORM *)(state->_tls + 0x290));
        return;
      }
    }
  }
  return;
}

Assistant:

void al_restore_state(ALLEGRO_STATE const *state)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;
   int flags;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   flags = stored->flags;

#define _RESTORE(x) (tls->x = stored->tls.x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _RESTORE(new_display_flags);
      _RESTORE(new_display_refresh_rate);
      _RESTORE(new_display_adapter);
      _RESTORE(new_window_x);
      _RESTORE(new_window_y);
      _RESTORE(new_display_settings);
      _al_sane_strncpy(tls->new_window_title, stored->tls.new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _RESTORE(new_bitmap_format);
      _RESTORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      if (tls->current_display != stored->tls.current_display) {
         _al_set_current_display_only(stored->tls.current_display);
         ASSERT(tls->current_display == stored->tls.current_display);
      }
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      if (tls->target_bitmap != stored->tls.target_bitmap) {
         al_set_target_bitmap(stored->tls.target_bitmap);
         ASSERT(tls->target_bitmap == stored->tls.target_bitmap);
      }
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      tls->current_blender = stored->stored_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _RESTORE(new_file_interface);
      _RESTORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_transform(&stored->stored_transform);
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_projection_transform(&stored->stored_projection_transform);
   }

#undef _RESTORE
}